

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expected.t.cpp
# Opt level: O0

ostream * operator<<(ostream *os,OracleVal *o)

{
  ostream *poVar1;
  lest local_38 [32];
  OracleVal *local_18;
  OracleVal *o_local;
  ostream *os_local;
  
  local_18 = o;
  o_local = (OracleVal *)os;
  poVar1 = std::operator<<(os,"[oracle:");
  lest::to_string_abi_cxx11_(local_38,*(int *)(local_18 + 4));
  poVar1 = std::operator<<(poVar1,(string *)local_38);
  poVar1 = std::operator<<(poVar1,"]");
  std::__cxx11::string::~string((string *)local_38);
  return poVar1;
}

Assistant:

std::ostream & operator<<( std::ostream & os, OracleVal const & o )
{
    using lest::to_string;
    return os << "[oracle:" << to_string( o.i ) << "]";
}